

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_declare_const
          (irGenerator *this,string *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int id)

{
  mapped_type *this_00;
  _Optional_payload_base<int> in_RDX;
  string *in_RSI;
  GlobalValue globalValue;
  ConstValue *in_stack_fffffffffffffef8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  ConstValue *in_stack_ffffffffffffff08;
  string local_d0 [8];
  key_type *in_stack_ffffffffffffff38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *in_stack_ffffffffffffff40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  optional<int> local_78 [2];
  int in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  irGenerator *in_stack_ffffffffffffffa8;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::optional<int>::optional(local_78);
  arm::ConstValue::ConstValue
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(optional<int>)in_RDX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDX);
  std::__cxx11::string::string(local_d0,in_RSI);
  getConstName(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
            ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  arm::ConstValue::operator=(this_00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string(local_d0);
  arm::ConstValue::~ConstValue((ConstValue *)0x25d564);
  return;
}

Assistant:

void irGenerator::ir_declare_const(string name,
                                   std::vector<std::uint32_t> values, int id) {
  GlobalValue globalValue = GlobalValue(values);
  _package.global_values[getConstName(name, id)] = globalValue;
}